

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

void __thiscall
QDomEntityPrivate::save(QDomEntityPrivate *this,QTextStream *s,int param_2,int param_3)

{
  char16_t *pcVar1;
  Data *pDVar2;
  Data *pDVar3;
  qsizetype qVar4;
  char cVar5;
  QTextStream *pQVar6;
  char16_t *pcVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QArrayData *local_c8;
  char16_t *pcStack_c0;
  qsizetype local_b8;
  QStringBuilder<QString,_QString> local_a8;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (this->super_QDomNodePrivate).name.d.d;
  local_58.d.ptr = (this->super_QDomNodePrivate).name.d.ptr;
  local_58.d.size = (this->super_QDomNodePrivate).name.d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  cVar5 = QString::startsWith((QChar)(char16_t)&local_58,0x25);
  if (cVar5 != '\0') {
    QString::mid((longlong)&local_c8,(longlong)&local_58);
    local_a8.b.d.size = local_b8;
    local_a8.b.d.ptr = pcStack_c0;
    local_a8.b.d.d = (Data *)local_c8;
    local_a8.a.d.d = (Data *)0x0;
    local_a8.a.d.ptr = L"% ";
    local_a8.a.d.size = 2;
    local_c8 = (QArrayData *)0x0;
    pcStack_c0 = (char16_t *)0x0;
    local_b8 = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>(&local_78,&local_a8);
    pcVar7 = local_58.d.ptr;
    pDVar3 = local_58.d.d;
    qVar4 = local_78.d.size;
    pDVar2 = local_78.d.d;
    local_78.d.d = local_58.d.d;
    local_58.d.d = pDVar2;
    local_58.d.ptr = local_78.d.ptr;
    local_78.d.ptr = pcVar7;
    local_78.d.size = local_58.d.size;
    local_58.d.size = qVar4;
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_a8);
    if (local_c8 != (QArrayData *)0x0) {
      LOCK();
      (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_c8,2,0x10);
      }
    }
  }
  pcVar7 = (this->m_pub).d.ptr;
  pcVar1 = (this->m_sys).d.ptr;
  pQVar6 = (QTextStream *)QTextStream::operator<<(s,"<!ENTITY ");
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,&local_58);
  if (pcVar1 == (char16_t *)0x0 && pcVar7 == (char16_t *)0x0) {
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," \"");
    QString::toUtf8_helper(&local_78);
    local_a8.a.d.d = local_78.d.d;
    local_a8.a.d.ptr = local_78.d.ptr;
    local_a8.a.d.size = local_78.d.size;
    qVar4 = local_a8.a.d.size;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8.a.d.size._0_4_ = (int)local_78.d.size;
    if (0 < (int)local_a8.a.d.size) {
      pcVar7 = local_78.d.ptr;
      if (local_78.d.ptr == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QByteArray::_empty;
      }
      uVar9 = 0;
      iVar11 = (int)local_a8.a.d.size;
      local_a8.a.d.size = qVar4;
      do {
        uVar10 = (ulong)uVar9;
        cVar5 = *(char *)((long)pcVar7 + uVar10);
        iVar8 = 1;
        if (cVar5 == '&') {
          if (((int)(uVar10 + 1) < iVar11) && (*(char *)((long)pcVar7 + uVar10 + 1) == '#'))
          goto LAB_00115b7f;
        }
        else if ((cVar5 == '%') || (cVar5 == '\"')) {
LAB_00115b7f:
          QVar12.m_data = (storage_type *)0x5;
          QVar12.m_size = 1;
          QByteArray::replace((longlong)&local_a8,uVar10,QVar12);
          pcVar7 = local_a8.a.d.ptr;
          if (local_a8.a.d.ptr == (char16_t *)0x0) {
            pcVar7 = (char16_t *)&QByteArray::_empty;
          }
          iVar11 = iVar11 + 4;
          iVar8 = 5;
        }
        uVar9 = uVar9 + iVar8;
        qVar4 = local_a8.a.d.size;
      } while ((int)uVar9 < iVar11);
    }
    local_a8.a.d.size = qVar4;
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QByteArray *)&local_a8);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"\">");
    Qt::endl(pQVar6);
    if (&(local_a8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.a.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    QTextStream::operator<<(pQVar6,' ');
    if ((this->m_pub).d.ptr == (char16_t *)0x0) {
      pQVar6 = (QTextStream *)QTextStream::operator<<(s,"SYSTEM ");
      quotedValue(&local_a8.a,&this->m_sys);
      QTextStream::operator<<(pQVar6,&local_a8.a);
    }
    else {
      pQVar6 = (QTextStream *)QTextStream::operator<<(s,"PUBLIC ");
      quotedValue(&local_a8.a,&this->m_pub);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,&local_a8.a);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,' ');
      quotedValue(&local_78,&this->m_sys);
      QTextStream::operator<<(pQVar6,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_a8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((this->m_notationName).d.ptr != (char16_t *)0x0) {
      pQVar6 = (QTextStream *)QTextStream::operator<<(s," NDATA ");
      QTextStream::operator<<(pQVar6,&this->m_notationName);
    }
    pQVar6 = (QTextStream *)QTextStream::operator<<(s,'>');
    Qt::endl(pQVar6);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomEntityPrivate::save(QTextStream& s, int, int) const
{
    QString _name = name;
    if (_name.startsWith(u'%'))
        _name = u"% "_s + _name.mid(1);

    if (m_sys.isNull() && m_pub.isNull()) {
        s << "<!ENTITY " << _name << " \"" << encodeEntity(value.toUtf8()) << "\">" << Qt::endl;
    } else {
        s << "<!ENTITY " << _name << ' ';
        if (m_pub.isNull()) {
            s << "SYSTEM " << quotedValue(m_sys);
        } else {
            s << "PUBLIC " << quotedValue(m_pub) << ' ' << quotedValue(m_sys);
        }
        if (! m_notationName.isNull()) {
            s << " NDATA " << m_notationName;
        }
        s << '>' << Qt::endl;
    }
}